

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_c_q2d.c
# Opt level: O0

void func_exc_unpol(xc_func_type *p,size_t ip,double *rho,double *sigma,double *lapl,double *tau,
                   xc_mgga_out_params *out)

{
  double *pdVar1;
  bool bVar2;
  double *in_RCX;
  long lVar3;
  double *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R9;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  long *in_stack_00000008;
  hyb_mgga_xc_gas22_params *params;
  double tzk0;
  double t317;
  double t316;
  double t314;
  double t313;
  double t312;
  double t310;
  double t309;
  double t308;
  double t307;
  double t305;
  double t303;
  double t302;
  double t301;
  double t300;
  double t299;
  double t297;
  double t296;
  double t295;
  double t294;
  double t293;
  double t292;
  double t291;
  double t289;
  double t287;
  double t286;
  double t285;
  double t284;
  double t282;
  double t280;
  double t275;
  double t274;
  double t271;
  double t266;
  double t264;
  double t261;
  double t258;
  double t257;
  double t254;
  double t252;
  double t249;
  double t246;
  double t245;
  double t243;
  double t241;
  double t239;
  double t234;
  double t233;
  double t232;
  double t231;
  double t230;
  double t229;
  double t226;
  double t225;
  double t223;
  double t222;
  double t221;
  double t220;
  double t219;
  double t218;
  double t217;
  double t216;
  double t215;
  double t214;
  double t213;
  double t211;
  double t210;
  double t209;
  double t208;
  double t207;
  double t205;
  double t204;
  double t200;
  double t199;
  double t197;
  double t196;
  double t195;
  double t186;
  double t185;
  double t184;
  double t181;
  double t176;
  double t172;
  double t171;
  double t168;
  double t163;
  double t161;
  double t160;
  double t156;
  double t154;
  double t152;
  double t151;
  double t148;
  double t146;
  double t144;
  double t142;
  double t141;
  double t140;
  double t139;
  double t137;
  double t134;
  double t133;
  double t131;
  double t129;
  double t126;
  double t125;
  double t124;
  double t123;
  double t119;
  double t118;
  double t116;
  double t115;
  double t114;
  double t113;
  double t112;
  double t111;
  double t109;
  double t108;
  double t107;
  double t106;
  double t105;
  double t104;
  double t103;
  double t102;
  double t101;
  double t97;
  double t96;
  double t94;
  double t93;
  double t92;
  double t91;
  double t89;
  double t88;
  double t87;
  double t86;
  double t85;
  double t83;
  double t79;
  double t76;
  double t73;
  double t72;
  double t70;
  double t69;
  double t67;
  double t65;
  double t64;
  double t63;
  double t60;
  double t59;
  double t57;
  double t54;
  double t51;
  double t48;
  double t47;
  double t45;
  double t44;
  double t42;
  double t41;
  double t38;
  double t37;
  double t36;
  double t35;
  double t34;
  double t31;
  double t29;
  double t27;
  double t26;
  double t24;
  double t23;
  double t22;
  double t21;
  double t20;
  double t19;
  double t17;
  double t16;
  double t15;
  double t14;
  double t12;
  double t11;
  double t10;
  double t9;
  double t8;
  double t7;
  double t6;
  double t5;
  double t4;
  double local_678;
  double local_668;
  double local_660;
  double local_650;
  double local_648;
  double local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_620;
  double local_618;
  bool local_609;
  
  pdVar1 = (double *)in_RDI[0x2f];
  dVar4 = (double)(1.0 <= (double)in_RDI[0x31]);
  local_609 = *in_RDX / 2.0 <= (double)in_RDI[0x30] || dVar4 != 0.0;
  dVar5 = (double)local_609;
  dVar6 = cbrt(0.3183098861837907);
  dVar7 = dVar6 * 1.4422495703074083;
  dVar8 = (double)(2.0 <= (double)in_RDI[0x31]);
  local_650 = cbrt((double)in_RDI[0x31]);
  local_678 = local_650 * (double)in_RDI[0x31];
  local_618 = local_678;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_618 = 2.5198420997897464;
  }
  dVar9 = cbrt(*in_RDX);
  dVar10 = cbrt(9.0);
  dVar11 = 1.0 / dVar9;
  local_620 = local_650;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_620 = 1.2599210498948732;
  }
  local_630 = (dVar10 * dVar10 * dVar6 * dVar6 * (double)in_RDI[4] * 1.4422495703074083 * dVar11 *
              (1.2599210498948732 / local_620)) / 18.0;
  bVar2 = 1.35 <= local_630;
  dVar8 = (double)(1.35 < local_630);
  local_628 = local_630;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_628 = 1.35;
  }
  local_628 = local_628 * local_628;
  dVar10 = local_628 * local_628;
  dVar12 = dVar10 * dVar10;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_630 = 1.35;
  }
  dVar8 = sqrt(3.141592653589793);
  dVar13 = erf((1.0 / local_630) / 2.0);
  dVar14 = exp(-(1.0 / (local_630 * local_630)) / 4.0);
  if (((double)bVar2 != 0.0) || (NAN((double)bVar2))) {
    local_638 = (((((((1.0 / local_628) / 36.0 - (1.0 / dVar10) / 960.0) +
                    (1.0 / (dVar10 * local_628)) / 26880.0) - (1.0 / dVar12) / 829440.0) +
                  ((1.0 / dVar12) / local_628) / 28385280.0) -
                 ((1.0 / dVar12) / dVar10) / 1073479680.0) +
                ((1.0 / dVar12) / (dVar10 * local_628)) / 44590694400.0) -
                (1.0 / (dVar12 * dVar12)) / 2021444812800.0;
  }
  else {
    local_638 = -(local_630 * 2.6666666666666665) *
                (local_630 * 2.0 *
                 (-(local_630 * local_630 * 2.0) * (dVar14 - 1.0) + (dVar14 - 1.5)) + dVar8 * dVar13
                ) + 1.0;
  }
  dVar8 = pdVar1[1];
  dVar10 = *in_RCX;
  dVar13 = *in_RDX * *in_RDX;
  dVar14 = dVar9 * dVar9;
  dVar15 = (1.0 / dVar14) / dVar13;
  dVar16 = dVar15 * 1.5874010519681996;
  dVar15 = *in_RCX * 1.5874010519681996 * dVar15;
  dVar12 = pdVar1[2];
  dVar17 = cbrt(9.869604401089358);
  dVar17 = dVar17 * dVar17 * 3.3019272488946267;
  dVar18 = dVar17 * 0.3;
  dVar19 = *in_R9 * 1.5874010519681996 * ((1.0 / dVar14) / *in_RDX);
  dVar20 = dVar18 - dVar19;
  dVar18 = dVar18 + dVar19;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_640 = 0.0;
  }
  else {
    local_640 = dVar7 * 2.519842099789747 * 1.2599210498948732 * -0.046875 * local_618 * dVar9 *
                local_638 *
                (dVar12 * dVar20 * (1.0 / dVar18) +
                dVar8 * dVar10 * 0.003840616724010807 * dVar16 *
                (1.0 / (dVar15 * 0.003840616724010807 + 1.0)) + *pdVar1);
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_648 = (double)in_RDI[0x31];
  }
  else {
    local_648 = 1.0;
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_650 = 1.0 / local_650;
  }
  else {
    local_650 = 1.0;
  }
  dVar8 = dVar7 * 2.519842099789747 * dVar11 * 1.2599210498948732 * local_650;
  dVar10 = sqrt(dVar8);
  dVar12 = sqrt(dVar8);
  dVar12 = dVar8 * dVar12;
  dVar6 = dVar6 * dVar6 * 2.080083823051904;
  dVar21 = dVar6 * 1.5874010519681996 * (1.0 / dVar14) * 1.5874010519681996 * local_650 * local_650;
  dVar22 = log(16.081979498692537 /
               (dVar21 * 0.123235 + dVar12 * 0.204775 + dVar10 * 3.79785 + dVar8 * 0.8969) + 1.0);
  dVar22 = (dVar8 * 0.053425 + 1.0) * 0.0621814 * dVar22;
  local_660 = local_678;
  if ((double)in_RDI[0x31] < 0.0) {
    local_660 = 0.0;
  }
  dVar23 = ((local_618 + local_660) - 2.0) * 1.9236610509315362;
  dVar24 = log(32.16395899738507 /
               (dVar21 * 0.1562925 + dVar12 * 0.420775 + dVar10 * 7.05945 + dVar8 * 1.549425) + 1.0)
  ;
  dVar10 = log(29.608749977793437 /
               (dVar21 * 0.1241775 + dVar12 * 0.1100325 + dVar10 * 5.1785 + dVar8 * 0.905775) + 1.0)
  ;
  dVar10 = (dVar8 * 0.0278125 + 1.0) * dVar10;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_668 = 0.0;
  }
  else {
    local_668 = (local_648 *
                (dVar23 * 0.0197516734986138 * dVar10 +
                dVar23 * (dVar10 * -0.0197516734986138 +
                         (dVar8 * 0.05137 + 1.0) * -0.0310907 * dVar24 + dVar22) + -dVar22)) / 2.0;
  }
  dVar5 = pdVar1[3];
  dVar8 = *in_RCX;
  dVar23 = dVar15 * 0.46914023462026644 + 1.0;
  dVar10 = pdVar1[4];
  dVar12 = pdVar1[5];
  dVar24 = dVar20 * dVar20;
  dVar25 = dVar18 * dVar18;
  dVar21 = pdVar1[6];
  dVar26 = *in_RCX * *in_RCX;
  dVar26 = dVar26 * dVar26 * dVar26;
  dVar22 = dVar13 * dVar13 * dVar13 * dVar13;
  dVar27 = 1.0 / (dVar22 * dVar22);
  dVar28 = dVar23 * dVar23;
  dVar28 = (1.0 / (dVar28 * dVar28)) / dVar28;
  dVar22 = pdVar1[7];
  dVar11 = dVar7 * 2.519842099789747 * dVar11;
  dVar7 = sqrt(dVar11);
  dVar29 = sqrt(dVar11);
  dVar6 = dVar6 * 1.5874010519681996 * (1.0 / dVar14);
  dVar14 = log(16.081979498692537 /
               (dVar6 * 0.123235 + dVar11 * dVar29 * 0.204775 + dVar7 * 3.79785 + dVar11 * 0.8969) +
               1.0);
  if ((dVar4 == 0.0) && (!NAN(dVar4))) {
    local_678 = 1.0;
  }
  dVar29 = log(29.608749977793437 /
               (dVar6 * 0.1241775 + dVar11 * dVar29 * 0.1100325 + dVar7 * 5.1785 + dVar11 * 0.905775
               ) + 1.0);
  dVar4 = pdVar1[9];
  dVar19 = dVar17 * 0.6 * dVar19;
  dVar6 = *in_R9 * *in_R9 * 1.2599210498948732 * 4.0 * ((1.0 / dVar9) / (dVar13 * *in_RDX));
  dVar9 = dVar19 - dVar6;
  dVar9 = dVar9 * dVar9;
  dVar19 = dVar19 + dVar6;
  dVar19 = dVar19 * dVar19;
  dVar6 = pdVar1[10];
  dVar13 = dVar9 * dVar9 * dVar9;
  dVar17 = (1.0 / (dVar19 * dVar19)) / dVar19;
  dVar7 = pdVar1[0xb];
  dVar15 = cbrt(dVar15);
  if ((*in_stack_00000008 != 0) && ((*(uint *)(*in_RDI + 0x40) & 1) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xb];
    *(double *)(*in_stack_00000008 + lVar3 * 8) =
         local_640 * 2.0 +
         local_668 * 2.0 *
         (dVar22 * dVar24 * dVar24 * (1.0 / (dVar25 * dVar25)) * 0.17058312527037534 * dVar26 *
          dVar27 * dVar28 +
         dVar21 * dVar26 * 0.17058312527037534 * dVar27 * dVar28 +
         dVar12 * dVar24 * (1.0 / dVar25) +
         dVar5 * dVar8 * 0.46914023462026644 * dVar16 * (1.0 / dVar23) +
         dVar10 * dVar20 * (1.0 / dVar18)) +
         (((dVar11 * 0.053425 + 1.0) * -0.0621814 * dVar14 +
          (local_678 + local_678 + -2.0) * 1.9236610509315362 * 0.0197516734986138 *
          (dVar11 * 0.0278125 + 1.0) * dVar29) - (local_668 + local_668)) *
         (pdVar1[0xc] * dVar9 * (1.0 / dVar19) * dVar15 +
          dVar7 * dVar13 * dVar17 * dVar15 +
          dVar4 * dVar9 * (1.0 / dVar19) + dVar6 * dVar13 * dVar17 + pdVar1[8]) +
         *(double *)(*in_stack_00000008 + lVar3 * 8);
  }
  return;
}

Assistant:

GPU_DEVICE_FUNCTION static inline void
func_exc_unpol(const xc_func_type *p, size_t ip, const double *rho, const double *sigma, xc_gga_out_params *out)
{
  double t1, t2, t3, t4, t5, t7, t8, t9;
  double t10, t11, t12, t13, t14, t15, t16, t17;
  double t18, t20, t21, t22, t23, t24, t25, t26;
  double t27, t29, t32, t33, t35, t37, t39, t40;
  double t41, t42, t43, t44, t45, t47, t48, t49;
  double t52, t53, t55, t58, t59, t60, t62, t64;
  double t65, t68, t70, t71, t73, t75, t78, t79;
  double t81, t83, t89, t91, t96, t99, t100, t103;
  double t104, t105, t106, t107, t108, t109, t110, t113;
  double t114, t116, t117, t118, t119, t121, t122, t125;
  double t126, t129, t130, t133, t134, t137, t138, t139;
  double t140, t141, t142, t143, t145, t146, t147, t148;
  double t149, t150, t152, t154, t155, t156, t158, t159;
  double t160, t161, t163, t164, t165, t166, t168, t170;
  double t174, t176, t177, t180, t182, t183, t184, t185;
  double t187, t189, t190, t194, t196, t198, tzk0;


  t1 = sigma[0] * sigma[0];
  t2 = rho[0] * rho[0];
  t3 = t2 * t2;
  t4 = POW_1_3(rho[0]);
  t5 = t4 * t4;
  t7 = 0.1e1 / t5 / t3;
  t8 = t1 * t7;
  t9 = M_CBRT2;
  t10 = t9 * t9;
  t11 = 0.1e1 <= p->zeta_threshold;
  t12 = POW_1_3(p->zeta_threshold);
  t13 = t12 * t12;
  t14 = my_piecewise3(t11, t13, 1);
  t15 = t14 * t14;
  t16 = t15 * t15;
  t17 = 0.1e1 / t16;
  t18 = t10 * t17;
  t20 = M_CBRT3;
  t21 = 0.1e1 / M_PI;
  t22 = POW_1_3(t21);
  t23 = t22 * t22;
  t24 = 0.1e1 / t23;
  t25 = t20 * t24;
  t26 = M_CBRT4;
  t27 = t26 * t26;
  t29 = 0.1e1 / t4 / t2;
  t32 = 0.1e1 / t15;
  t33 = t20 * t20;
  t35 = 0.1e1 / t22;
  t37 = t32 * t33 * t35 * t26;
  t39 = sigma[0] * t29 * t9 * t37 / 0.96e2;
  t40 = 0.1e1 + t39;
  t41 = t27 * t40;
  t42 = t1 * sigma[0];
  t43 = t2 * rho[0];
  t44 = t3 * t43;
  t45 = 0.1e1 / t44;
  t47 = t16 * t15;
  t48 = 0.1e1 / t47;
  t49 = t48 * M_PI;
  t52 = 0.1e7 + t42 * t45 * t49 / 0.12288e5;
  t53 = 0.1e1 / t52;
  t55 = t25 * t41 * t53;
  t58 = 0.1e1 - t8 * t18 * t55 / 0.3072e4;
  t59 = t20 * t22;
  t60 = 0.1e1 / t4;
  t62 = t59 * t27 * t60;
  t64 = 0.1e1 + 0.53425e-1 * t62;
  t65 = sqrt(t62);
  t68 = POW_3_2(t62);
  t70 = t33 * t23;
  t71 = 0.1e1 / t5;
  t73 = t70 * t26 * t71;
  t75 = 0.379785e1 * t65 + 0.8969e0 * t62 + 0.204775e0 * t68 + 0.123235e0 * t73;
  t78 = 0.1e1 + 0.16081979498692535067e2 / t75;
  t79 = log(t78);
  t81 = 0.621814e-1 * t64 * t79;
  t83 = my_piecewise3(t11, t12 * p->zeta_threshold, 1);
  t89 = (0.2e1 * t83 - 0.2e1) / (0.2e1 * t9 - 0.2e1);
  t91 = 0.1e1 + 0.278125e-1 * t62;
  t96 = 0.51785e1 * t65 + 0.905775e0 * t62 + 0.1100325e0 * t68 + 0.1241775e0 * t73;
  t99 = 0.1e1 + 0.29608749977793437516e2 / t96;
  t100 = log(t99);
  t103 = 0.19751673498613801407e-1 * t89 * t91 * t100;
  t104 = log(0.2e1);
  t105 = 0.1e1 - t104;
  t106 = M_PI * M_PI;
  t107 = 0.1e1 / t106;
  t108 = t105 * t107;
  t109 = t15 * t14;
  t110 = 0.1e1 / t105;
  t113 = 0.1e1 / t109;
  t114 = t106 * t113;
  t116 = exp(-(-t81 + t103) * t110 * t114);
  t117 = t116 - 0.1e1;
  t118 = 0.1e1 / t117;
  t119 = t110 * t118;
  t121 = t25 * t27;
  t122 = t18 * t121;
  t125 = t39 + 0.21437009059034868486e-3 * t119 * t8 * t122;
  t126 = t125 * t110;
  t129 = 0.1e1 + 0.65854491829355115987e0 * t119 * t125;
  t130 = 0.1e1 / t129;
  t133 = 0.1e1 + 0.65854491829355115987e0 * t126 * t130;
  t134 = log(t133);
  t137 = t108 * t109 * t134 + t103 - t81;
  t138 = t58 * t137;
  t139 = t18 * t20;
  t140 = t8 * t139;
  t141 = t24 * t27;
  t142 = t40 * t53;
  t143 = sqrt(0.3e1);
  t145 = M_CBRT6;
  t146 = t145 * t145;
  t147 = POW_1_3(t106);
  t148 = 0.1e1 / t147;
  t149 = t146 * t148;
  t150 = sqrt(sigma[0]);
  t152 = 0.1e1 / t4 / rho[0];
  t154 = t149 * t150 * t152;
  t155 = sqrt(t154);
  t156 = t143 * t60 * t155;
  t158 = 0.1e1 / t2;
  t159 = t158 * t146;
  t160 = t148 * t150;
  t161 = t159 * t160;
  t163 = 0.1e1 / rho[0];
  t164 = t143 * t163;
  t165 = t155 * t154;
  t166 = t164 * t165;
  t168 = 0.245130624e-1 * t156 + 0.138498611712e-1 * t161 + 0.2310999830832e-3 * t166;
  t170 = POW_3_2(t156);
  t174 = 0.2846248e0 * t156 - 0.31313960595450713442e-2 * t170 + 0.8226186096e-1 * t161 + 0.120051939264e-2 * t166;
  t176 = 0.1e1 + 0.1e1 / t174;
  t177 = log(t176);
  t180 = exp(-0.3801624e0 * t156);
  t182 = M_SQRT2;
  t183 = (t180 - 0.1e1) * t182;
  t184 = t183 * t143;
  t185 = 0.1e1 / t155;
  t187 = sqrt(p->zeta_threshold);
  t189 = my_piecewise3(t11, t187 * p->zeta_threshold, 1);
  t190 = t189 - 0.1e1;
  t194 = -0.1925e0 + t168 * t177 - 0.49813753706383516671e0 * t184 * t4 * t185 * t190;
  t196 = t141 * t142 * t194;
  t198 = t140 * t196 / 0.3072e4;
  tzk0 = t138 + t198;

  if(out->zk != NULL && (p->info->flags & XC_FLAGS_HAVE_EXC))
    out->zk[ip*p->dim.zk + 0] += tzk0;

}